

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RAWToRGBARow_C(uint8_t *src_raw,uint8_t *dst_rgba,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t b;
  uint8_t g;
  uint8_t r;
  int x;
  int width_local;
  uint8_t *dst_rgba_local;
  uint8_t *src_raw_local;
  
  dst_rgba_local = dst_rgba;
  src_raw_local = src_raw;
  for (x = 0; x < width; x = x + 1) {
    uVar1 = *src_raw_local;
    uVar2 = src_raw_local[1];
    uVar3 = src_raw_local[2];
    *dst_rgba_local = 0xff;
    dst_rgba_local[1] = uVar3;
    dst_rgba_local[2] = uVar2;
    dst_rgba_local[3] = uVar1;
    dst_rgba_local = dst_rgba_local + 4;
    src_raw_local = src_raw_local + 3;
  }
  return;
}

Assistant:

void RAWToRGBARow_C(const uint8_t* src_raw, uint8_t* dst_rgba, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t r = src_raw[0];
    uint8_t g = src_raw[1];
    uint8_t b = src_raw[2];
    dst_rgba[0] = 255u;
    dst_rgba[1] = b;
    dst_rgba[2] = g;
    dst_rgba[3] = r;
    dst_rgba += 4;
    src_raw += 3;
  }
}